

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O0

void __thiscall Fl_Pixmap::desaturate(Fl_Pixmap *this)

{
  char cVar1;
  int iVar2;
  char **ppcVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  char *pcStack_140;
  char what;
  char *previous_word;
  char *p;
  uchar *cmap;
  uchar b;
  uchar g;
  int iStack_120;
  uchar r;
  int chars_per_pixel;
  int ncolors;
  int i;
  char line [255];
  Fl_Pixmap *this_local;
  
  (*(this->super_Fl_Image)._vptr_Fl_Image[8])();
  copy_data(this);
  ppcVar3 = Fl_Image::data(&this->super_Fl_Image);
  __isoc99_sscanf(*ppcVar3,"%*d%*d%d%d",&stack0xfffffffffffffee0,(long)&cmap + 4);
  if (iStack_120 < 0) {
    iStack_120 = -iStack_120;
    ppcVar3 = Fl_Image::data(&this->super_Fl_Image);
    p = ppcVar3[1];
    for (chars_per_pixel = 0; chars_per_pixel < iStack_120; chars_per_pixel = chars_per_pixel + 1) {
      cVar1 = (char)(((uint)(byte)p[1] * 0x1f + (uint)(byte)p[2] * 0x3d + (uint)(byte)p[3] * 8) /
                    100);
      p[3] = cVar1;
      p[2] = cVar1;
      p[1] = cVar1;
      p = p + 4;
    }
  }
  else {
    for (chars_per_pixel = 0; chars_per_pixel < iStack_120; chars_per_pixel = chars_per_pixel + 1) {
      ppcVar3 = Fl_Image::data(&this->super_Fl_Image);
      previous_word = ppcVar3[chars_per_pixel + 1] + (long)cmap._4_4_ + 1;
      pcStack_140 = previous_word;
      while( true ) {
        while( true ) {
          bVar6 = false;
          if (*previous_word != '\0') {
            iVar2 = isspace((int)*previous_word);
            bVar6 = iVar2 != 0;
          }
          if (!bVar6) break;
          previous_word = previous_word + 1;
        }
        cVar1 = *previous_word;
        do {
          previous_word = previous_word + 1;
          bVar6 = false;
          if (*previous_word != '\0') {
            iVar2 = isspace((int)*previous_word);
            bVar6 = iVar2 == 0;
          }
        } while (bVar6);
        while( true ) {
          bVar6 = false;
          if (*previous_word != '\0') {
            iVar2 = isspace((int)*previous_word);
            bVar6 = iVar2 != 0;
          }
          if (!bVar6) break;
          previous_word = previous_word + 1;
        }
        if (*previous_word == '\0') break;
        if (cVar1 == 'c') goto LAB_0020d499;
        pcStack_140 = previous_word;
        while( true ) {
          bVar6 = false;
          if (*previous_word != '\0') {
            iVar2 = isspace((int)*previous_word);
            bVar6 = iVar2 == 0;
          }
          if (!bVar6) break;
          previous_word = previous_word + 1;
        }
      }
      previous_word = pcStack_140;
LAB_0020d499:
      iVar2 = fl_parse_color(previous_word,(uchar *)((long)&cmap + 3),(uchar *)((long)&cmap + 2),
                             (uchar *)((long)&cmap + 1));
      if (iVar2 != 0) {
        cmap._2_1_ = (byte)(((uint)cmap._3_1_ * 0x1f + (uint)cmap._2_1_ * 0x3d +
                            (uint)cmap._1_1_ * 8) / 100);
        if (cmap._4_4_ < 2) {
          ppcVar3 = Fl_Image::data(&this->super_Fl_Image);
          sprintf((char *)&ncolors,"%c c #%02X%02X%02X",
                  (ulong)(uint)(int)*ppcVar3[chars_per_pixel + 1],(ulong)cmap._2_1_,
                  (ulong)cmap._2_1_,(ulong)cmap._2_1_);
        }
        else {
          ppcVar3 = Fl_Image::data(&this->super_Fl_Image);
          cVar1 = *ppcVar3[chars_per_pixel + 1];
          ppcVar3 = Fl_Image::data(&this->super_Fl_Image);
          sprintf((char *)&ncolors,"%c%c c #%02X%02X%02X",(ulong)(uint)(int)cVar1,
                  (ulong)(uint)(int)ppcVar3[chars_per_pixel + 1][1],(ulong)cmap._2_1_,
                  (ulong)cmap._2_1_,(uint)cmap._2_1_);
        }
        ppcVar3 = Fl_Image::data(&this->super_Fl_Image);
        if (ppcVar3[chars_per_pixel + 1] != (char *)0x0) {
          operator_delete__(ppcVar3[chars_per_pixel + 1]);
        }
        sVar4 = strlen((char *)&ncolors);
        pcVar5 = (char *)operator_new__(sVar4 + 1);
        ppcVar3 = Fl_Image::data(&this->super_Fl_Image);
        ppcVar3[chars_per_pixel + 1] = pcVar5;
        ppcVar3 = Fl_Image::data(&this->super_Fl_Image);
        strcpy(ppcVar3[chars_per_pixel + 1],(char *)&ncolors);
      }
    }
  }
  return;
}

Assistant:

void Fl_Pixmap::desaturate() {
  // Delete any existing pixmap/mask objects...
  uncache();

  // Allocate memory as needed...
  copy_data();

  // Update the colormap to grayscale...
  char		line[255];	// New colormap line
  int		i,		// Looping var
		ncolors,	// Number of colors in image
		chars_per_pixel;// Characters per color
  uchar		r, g, b;

  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);

  if (ncolors < 0) {
    // Update FLTK colormap...
    ncolors = -ncolors;
    uchar *cmap = (uchar *)(data()[1]);
    for (i = 0; i < ncolors; i ++, cmap += 4) {
      g = (uchar)((cmap[1] * 31 + cmap[2] * 61 + cmap[3] * 8) / 100);
      cmap[1] = cmap[2] = cmap[3] = g;
    }
  } else {
    // Update standard XPM colormap...
    for (i = 0; i < ncolors; i ++) {
      // look for "c word", or last word if none:
      const char *p = data()[i + 1] + chars_per_pixel + 1;
      const char *previous_word = p;
      for (;;) {
	while (*p && isspace(*p)) p++;
	char what = *p++;
	while (*p && !isspace(*p)) p++;
	while (*p && isspace(*p)) p++;
	if (!*p) {p = previous_word; break;}
	if (what == 'c') break;
	previous_word = p;
	while (*p && !isspace(*p)) p++;
      }

      if (fl_parse_color(p, r, g, b)) {
        g = (uchar)((r * 31 + g * 61 + b * 8) / 100);

        if (chars_per_pixel > 1) sprintf(line, "%c%c c #%02X%02X%02X", data()[i + 1][0],
	                                 data()[i + 1][1], g, g, g);
        else sprintf(line, "%c c #%02X%02X%02X", data()[i + 1][0], g, g, g);

        delete[] (char *)data()[i + 1];
	((char **)data())[i + 1] = new char[strlen(line) + 1];
	strcpy((char *)data()[i + 1], line);
      }
    }
  }
}